

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmbedTexturesProcess.cpp
# Opt level: O3

void __thiscall Assimp::EmbedTexturesProcess::Execute(EmbedTexturesProcess *this,aiScene *pScene)

{
  char *__s;
  aiMaterial *pMat;
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  Logger *this_00;
  ulong uVar4;
  uint index;
  aiTextureType type;
  aiString path;
  string local_5f0;
  long *local_5d0;
  long local_5c0 [2];
  undefined1 local_5b0 [380];
  aiString local_434;
  
  if ((pScene != (aiScene *)0x0) && (pScene->mRootNode != (aiNode *)0x0)) {
    local_434.length = 0;
    local_434.data[0] = '\0';
    memset(local_434.data + 1,0x1b,0x3ff);
    if (pScene->mNumMaterials != 0) {
      uVar4 = 0;
      do {
        pMat = pScene->mMaterials[uVar4];
        type = aiTextureType_DIFFUSE;
        do {
          uVar2 = aiGetMaterialTextureCount(pMat,type);
          if (uVar2 != 0) {
            index = 0;
            do {
              aiGetMaterialTexture
                        (pMat,type,index,&local_434,(aiTextureMapping *)0x0,(uint *)0x0,
                         (ai_real *)0x0,(aiTextureOp *)0x0,(aiTextureMapMode *)0x0,(uint *)0x0);
              if (local_434.data[0] != '*') {
                __s = local_434.data;
                local_5f0._M_dataplus._M_p = (pointer)&local_5f0.field_2;
                sVar3 = strlen(__s);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_5f0,__s,__s + sVar3);
                bVar1 = addTexture(this,pScene,&local_5f0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
                  operator_delete(local_5f0._M_dataplus._M_p,
                                  local_5f0.field_2._M_allocated_capacity + 1);
                }
                if (bVar1) {
                  snprintf(local_434.data,0x400,"*%u",(ulong)(pScene->mNumTextures - 1));
                  aiMaterial::AddProperty(pMat,&local_434,"$tex.file",type,index);
                }
              }
              index = index + 1;
            } while (uVar2 != index);
          }
          type = type + aiTextureType_DIFFUSE;
        } while (type != aiTextureType_UNKNOWN);
        uVar4 = uVar4 + 1;
      } while (uVar4 < pScene->mNumMaterials);
    }
    this_00 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[41]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5b0,
               (char (*) [41])"EmbedTexturesProcess finished. Embedded ");
    std::ostream::_M_insert<unsigned_long>((ulong)local_5b0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b0," textures.",10);
    std::__cxx11::stringbuf::str();
    Logger::info(this_00,(char *)local_5d0);
    if (local_5d0 != local_5c0) {
      operator_delete(local_5d0,local_5c0[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
    std::ios_base::~ios_base((ios_base *)(local_5b0 + 0x70));
  }
  return;
}

Assistant:

void EmbedTexturesProcess::Execute(aiScene* pScene) {
    if (pScene == nullptr || pScene->mRootNode == nullptr) return;

    aiString path;

    uint32_t embeddedTexturesCount = 0u;

    for (auto matId = 0u; matId < pScene->mNumMaterials; ++matId) {
        auto material = pScene->mMaterials[matId];

        for (auto ttId = 1u; ttId < AI_TEXTURE_TYPE_MAX; ++ttId) {
            auto tt = static_cast<aiTextureType>(ttId);
            auto texturesCount = material->GetTextureCount(tt);

            for (auto texId = 0u; texId < texturesCount; ++texId) {
                material->GetTexture(tt, texId, &path);
                if (path.data[0] == '*') continue; // Already embedded

                // Indeed embed
                if (addTexture(pScene, path.data)) {
                    auto embeddedTextureId = pScene->mNumTextures - 1u;
                    ::ai_snprintf(path.data, 1024, "*%u", embeddedTextureId);
                    material->AddProperty(&path, AI_MATKEY_TEXTURE(tt, texId));
                    embeddedTexturesCount++;
                }
            }
        }
    }

    ASSIMP_LOG_INFO_F("EmbedTexturesProcess finished. Embedded ", embeddedTexturesCount, " textures." );
}